

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O3

bool WaitForSession(SSL *ssl,int sock)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int ssl_err;
  fd_set *__arr;
  fd_set read_fds;
  uint8_t buffer [512];
  fd_set local_2b8;
  undefined1 local_238 [520];
  
  local_2b8.fds_bits[0xe] = 0;
  local_2b8.fds_bits[0xf] = 0;
  local_2b8.fds_bits[0xc] = 0;
  local_2b8.fds_bits[0xd] = 0;
  local_2b8.fds_bits[10] = 0;
  local_2b8.fds_bits[0xb] = 0;
  local_2b8.fds_bits[8] = 0;
  local_2b8.fds_bits[9] = 0;
  local_2b8.fds_bits[6] = 0;
  local_2b8.fds_bits[7] = 0;
  local_2b8.fds_bits[4] = 0;
  local_2b8.fds_bits[5] = 0;
  local_2b8.fds_bits[2] = 0;
  local_2b8.fds_bits[3] = 0;
  local_2b8.fds_bits[0] = 0;
  local_2b8.fds_bits[1] = 0;
  bVar1 = SocketSetNonBlocking(sock,true);
  if (bVar1) {
    bVar1 = true;
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        resume_session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      iVar2 = sock + 0x3f;
      if (-1 < sock) {
        iVar2 = sock;
      }
      do {
        local_2b8.fds_bits[iVar2 >> 6] =
             local_2b8.fds_bits[iVar2 >> 6] | 1L << ((byte)(sock % 0x40) & 0x3f);
        iVar3 = select(sock + 1,&local_2b8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)0x0);
        if (iVar3 < 1) {
          perror("select");
          goto LAB_00123a86;
        }
        iVar3 = SSL_read((SSL *)ssl,local_238,0x200);
        if (iVar3 < 1) {
          ssl_err = SSL_get_error((SSL *)ssl,iVar3);
          if (ssl_err != 2) {
            PrintSSLError(_stderr,"Error while reading",ssl_err,iVar3);
            goto LAB_00123a86;
          }
        }
      } while ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
               resume_session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
               (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0);
      bVar1 = true;
    }
  }
  else {
LAB_00123a86:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool WaitForSession(SSL *ssl, int sock) {
  fd_set read_fds;
  FD_ZERO(&read_fds);

  if (!SocketSetNonBlocking(sock, true)) {
    return false;
  }

  while (!resume_session) {
#if defined(OPENSSL_WINDOWS)
    // Windows sockets are really of type SOCKET, not int, but everything here
    // casts them to ints. Clang gets unhappy about signed values as a result.
    //
    // TODO(davidben): Keep everything as the appropriate platform type.
    FD_SET(static_cast<SOCKET>(sock), &read_fds);
#else
    FD_SET(sock, &read_fds);
#endif
    int ret = select(sock + 1, &read_fds, NULL, NULL, NULL);
    if (ret <= 0) {
      perror("select");
      return false;
    }

    uint8_t buffer[512];
    int ssl_ret = SSL_read(ssl, buffer, sizeof(buffer));

    if (ssl_ret <= 0) {
      int ssl_err = SSL_get_error(ssl, ssl_ret);
      if (ssl_err == SSL_ERROR_WANT_READ) {
        continue;
      }
      PrintSSLError(stderr, "Error while reading", ssl_err, ssl_ret);
      return false;
    }
  }

  return true;
}